

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerHLSL::emit_access_chain(CompilerHLSL *this,Instruction *instruction)

{
  uint uVar1;
  uint32_t uVar2;
  SPIRAccessChain *pSVar3;
  bool bVar4;
  int iVar5;
  uint32_t *args;
  SPIRType *pSVar6;
  SPIRType *pSVar7;
  SPIRAccessChain *e;
  uint32_t uVar8;
  uint32_t i;
  ulong uVar9;
  bool row_major_matrix;
  uint32_t array_stride;
  uint32_t matrix_stride;
  SPIRType *local_90;
  SPIRAccessChain *local_88;
  SPIRVariable *local_80;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  offsets;
  string base;
  
  args = Compiler::stream((Compiler *)this,instruction);
  uVar1 = instruction->length;
  pSVar6 = Compiler::expression_type((Compiler *)this,args[2]);
  local_88 = Compiler::maybe_get<spirv_cross::SPIRAccessChain>((Compiler *)this,args[2]);
  uVar9 = 0;
  if (local_88 == (SPIRAccessChain *)0x0) {
    if (pSVar6->storage != StorageBuffer) {
      bVar4 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(pSVar6->super_IVariant).self.id,BufferBlock);
      if (!bVar4) goto LAB_001ba6a3;
    }
    uVar9 = (pSVar6->array).super_VectorView<unsigned_int>.buffer_size;
    if (uVar1 - 3 <= uVar9) goto LAB_001ba6a3;
  }
  local_90 = pSVar6;
  local_80 = Compiler::maybe_get_backing_variable((Compiler *)this,args[2]);
  if (local_80 != (SPIRVariable *)0x0) {
    iVar5 = (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x26])
                      (this,(ulong)(local_80->super_IVariant).self.id);
    if ((char)iVar5 != '\0') {
LAB_001ba6a3:
      CompilerGLSL::emit_instruction(&this->super_CompilerGLSL,instruction);
      return;
    }
  }
  pSVar6 = local_90;
  base._M_dataplus._M_p = (pointer)&base.field_2;
  base._M_string_length = 0;
  base.field_2._M_local_buf[0] = '\0';
  uVar8 = (uint32_t)uVar9;
  if (uVar8 == 0) {
    if (local_88 != (SPIRAccessChain *)0x0) {
      ::std::__cxx11::string::_M_assign((string *)&base);
      goto LAB_001ba6e0;
    }
    CompilerGLSL::to_expression_abi_cxx11_(&offsets.first,&this->super_CompilerGLSL,args[2],true);
  }
  else {
    uVar2 = args[2];
    pSVar7 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,*args);
    pSVar6 = local_90;
    CompilerGLSL::access_chain_abi_cxx11_
              (&offsets.first,&this->super_CompilerGLSL,uVar2,args + 3,uVar8,pSVar7,
               (AccessChainMeta *)0x0,false);
  }
  ::std::__cxx11::string::operator=((string *)&base,(string *)&offsets);
  ::std::__cxx11::string::~string((string *)&offsets);
LAB_001ba6e0:
  pSVar7 = Compiler::get_pointee_type((Compiler *)this,pSVar6);
  uVar9 = uVar9 & 0xffffffff;
  while( true ) {
    pSVar3 = local_88;
    iVar5 = (int)uVar9;
    uVar9 = (ulong)(iVar5 - 1);
    if (iVar5 == 0) {
      matrix_stride = 0;
      array_stride = 0;
      row_major_matrix = false;
      if (local_88 != (SPIRAccessChain *)0x0) {
        matrix_stride = local_88->matrix_stride;
        row_major_matrix = local_88->row_major_matrix;
        array_stride = local_88->array_stride;
      }
      CompilerGLSL::flattened_access_chain_offset_abi_cxx11_
                (&offsets,&this->super_CompilerGLSL,pSVar7,args + (uVar8 + 3),(uVar1 - uVar8) - 3,0,
                 1,&row_major_matrix,&matrix_stride,&array_stride,false);
      e = Compiler::
          set<spirv_cross::SPIRAccessChain,unsigned_int_const&,spv::StorageClass_const&,std::__cxx11::string&,std::__cxx11::string&,unsigned_int&>
                    ((Compiler *)this,args[1],args,&pSVar6->storage,&base,&offsets.first,
                     &offsets.second);
      e->row_major_matrix = row_major_matrix;
      e->matrix_stride = matrix_stride;
      e->array_stride = array_stride;
      bVar4 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,args[2]);
      e->immutable = bVar4;
      if (local_80 == (SPIRVariable *)0x0) {
        uVar8 = 0;
      }
      else {
        uVar8 = (local_80->super_IVariant).self.id;
      }
      (e->loaded_from).id = uVar8;
      if (pSVar3 != (SPIRAccessChain *)0x0) {
        ::std::__cxx11::string::append((string *)&e->dynamic_index);
        e->static_index = e->static_index + pSVar3->static_index;
      }
      for (uVar9 = 2; uVar9 < uVar1; uVar9 = uVar9 + 1) {
        Compiler::inherit_expression_dependencies((Compiler *)this,args[1],args[uVar9]);
        Compiler::add_implied_read_expression((Compiler *)this,e,args[uVar9]);
      }
      ::std::__cxx11::string::~string((string *)&offsets);
      ::std::__cxx11::string::~string((string *)&base);
      return;
    }
    uVar2 = (pSVar7->parent_type).id;
    if (uVar2 == 0) break;
    pSVar7 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
  }
  __assert_fail("basetype->parent_type",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_hlsl.cpp"
                ,0x1453,"void spirv_cross::CompilerHLSL::emit_access_chain(const Instruction &)");
}

Assistant:

void CompilerHLSL::emit_access_chain(const Instruction &instruction)
{
	auto ops = stream(instruction);
	uint32_t length = instruction.length;

	bool need_byte_access_chain = false;
	auto &type = expression_type(ops[2]);
	const auto *chain = maybe_get<SPIRAccessChain>(ops[2]);

	if (chain)
	{
		// Keep tacking on an existing access chain.
		need_byte_access_chain = true;
	}
	else if (type.storage == StorageClassStorageBuffer || has_decoration(type.self, DecorationBufferBlock))
	{
		// If we are starting to poke into an SSBO, we are dealing with ByteAddressBuffers, and we need
		// to emit SPIRAccessChain rather than a plain SPIRExpression.
		uint32_t chain_arguments = length - 3;
		if (chain_arguments > type.array.size())
			need_byte_access_chain = true;
	}

	if (need_byte_access_chain)
	{
		// If we have a chain variable, we are already inside the SSBO, and any array type will refer to arrays within a block,
		// and not array of SSBO.
		uint32_t to_plain_buffer_length = chain ? 0u : static_cast<uint32_t>(type.array.size());

		auto *backing_variable = maybe_get_backing_variable(ops[2]);

		if (backing_variable != nullptr && is_user_type_structured(backing_variable->self))
		{
			CompilerGLSL::emit_instruction(instruction);
			return;
		}

		string base;
		if (to_plain_buffer_length != 0)
			base = access_chain(ops[2], &ops[3], to_plain_buffer_length, get<SPIRType>(ops[0]));
		else if (chain)
			base = chain->base;
		else
			base = to_expression(ops[2]);

		// Start traversing type hierarchy at the proper non-pointer types.
		auto *basetype = &get_pointee_type(type);

		// Traverse the type hierarchy down to the actual buffer types.
		for (uint32_t i = 0; i < to_plain_buffer_length; i++)
		{
			assert(basetype->parent_type);
			basetype = &get<SPIRType>(basetype->parent_type);
		}

		uint32_t matrix_stride = 0;
		uint32_t array_stride = 0;
		bool row_major_matrix = false;

		// Inherit matrix information.
		if (chain)
		{
			matrix_stride = chain->matrix_stride;
			row_major_matrix = chain->row_major_matrix;
			array_stride = chain->array_stride;
		}

		auto offsets = flattened_access_chain_offset(*basetype, &ops[3 + to_plain_buffer_length],
		                                             length - 3 - to_plain_buffer_length, 0, 1, &row_major_matrix,
		                                             &matrix_stride, &array_stride);

		auto &e = set<SPIRAccessChain>(ops[1], ops[0], type.storage, base, offsets.first, offsets.second);
		e.row_major_matrix = row_major_matrix;
		e.matrix_stride = matrix_stride;
		e.array_stride = array_stride;
		e.immutable = should_forward(ops[2]);
		e.loaded_from = backing_variable ? backing_variable->self : ID(0);

		if (chain)
		{
			e.dynamic_index += chain->dynamic_index;
			e.static_index += chain->static_index;
		}

		for (uint32_t i = 2; i < length; i++)
		{
			inherit_expression_dependencies(ops[1], ops[i]);
			add_implied_read_expression(e, ops[i]);
		}
	}
	else
	{
		CompilerGLSL::emit_instruction(instruction);
	}
}